

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base.cpp
# Opt level: O2

void __thiscall xmrig::Base::Base(Base *this,Process *process)

{
  BasePrivate *this_00;
  
  (this->super_IWatcherListener)._vptr_IWatcherListener = (_func_int **)&PTR__Base_001baa38;
  (this->super_IApiListener)._vptr_IApiListener = (_func_int **)&PTR__Base_001baa88;
  this_00 = (BasePrivate *)operator_new(0x30);
  BasePrivate::BasePrivate(this_00,process);
  this->d_ptr = this_00;
  return;
}

Assistant:

xmrig::Base::Base(Process *process)
    : d_ptr(new BasePrivate(process))
{
}